

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

void __thiscall CSEInit::CSEInit(CSEInit *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  OpCode local_14;
  byte local_11;
  OpCode opcode;
  uint8 hash;
  CSEInit *this_local;
  
  local_11 = 1;
  local_14 = EndOfBlock;
  do {
    if (XORPS < local_14) {
      return;
    }
    bVar2 = Js::OpCodeUtil::IsValidOpcode(local_14);
    if (((bVar2) && (bVar2 = OpCodeAttr::CanCSE(local_14), bVar2)) &&
       (bVar2 = OpCodeAttr::ByteCodeOnly(local_14), !bVar2)) {
      OpCodeToHash[(int)(uint)local_14] = local_11;
      HashToOpCode[local_11] = local_14;
      local_11 = local_11 + 1;
      if (local_11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x1a,"(hash != 0)","Too many CSE\'able opcodes");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    uVar3 = Js::operator+(local_14,1);
    local_14 = (OpCode)uVar3;
  } while( true );
}

Assistant:

CSEInit()
    {
        uint8 hash = 1;

        for (Js::OpCode opcode = (Js::OpCode)0; opcode < Js::OpCode::Count; opcode = (Js::OpCode)(opcode + 1))
        {
            if (Js::OpCodeUtil::IsValidOpcode(opcode) && OpCodeAttr::CanCSE(opcode) && !OpCodeAttr::ByteCodeOnly(opcode))
            {
                OpCodeToHash[(int)opcode] = hash;
                HashToOpCode[hash] = opcode;
                hash++;
                AssertMsg(hash != 0, "Too many CSE'able opcodes");
            }

        }
    }